

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O2

DdNode * extraZddGetSymmetricVars(DdManager *dd,DdNode *bF,DdNode *bG,DdNode *bVars)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  int iVar4;
  DdNode *bG_00;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  int iVar8;
  ulong uVar9;
  DdNode *pDVar10;
  
  pDVar7 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  pDVar10 = (DdNode *)((ulong)bG & 0xfffffffffffffffe);
  if ((pDVar7->index == 0x7fffffff) && (pDVar10->index == 0x7fffffff)) {
    if (bF == bG) {
      pDVar7 = extraZddGetSingletons(dd,bVars);
      return pDVar7;
    }
    return dd->zero;
  }
  if (dd->one == bVars) {
    __assert_fail("bVars != b1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                  ,0x335,
                  "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
  }
  pDVar3 = cuddCacheLookupZdd(dd,10,bF,bG,bVars);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  iVar2 = 0x7fffffff;
  iVar4 = 0x7fffffff;
  if ((ulong)pDVar7->index != 0x7fffffff) {
    iVar4 = dd->perm[pDVar7->index];
  }
  if ((ulong)pDVar10->index != 0x7fffffff) {
    iVar2 = dd->perm[pDVar10->index];
  }
  iVar8 = iVar2;
  if (iVar4 < iVar2) {
    iVar8 = iVar4;
  }
  if (dd->size <= iVar8) {
    __assert_fail("LevelFG < dd->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                  ,0x34b,
                  "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
  }
  pDVar3 = bVars;
  while (dd->perm[pDVar3->index] < iVar8) {
    pDVar3 = (pDVar3->type).kids.T;
  }
  if (iVar8 != dd->perm[pDVar3->index]) {
    __assert_fail("LevelFG == dd->perm[bVarsNew->index]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                  ,0x350,
                  "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
  }
  pDVar5 = bF;
  pDVar6 = bF;
  if (iVar4 <= iVar2) {
    pDVar5 = (pDVar7->type).kids.E;
    if (pDVar7 == bF) {
      pDVar6 = (pDVar7->type).kids.T;
    }
    else {
      pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
      pDVar6 = (DdNode *)((ulong)(pDVar7->type).kids.T ^ 1);
    }
  }
  pDVar7 = bG;
  bG_00 = bG;
  if (iVar2 <= iVar4) {
    pDVar7 = (pDVar10->type).kids.E;
    if (pDVar10 == bG) {
      bG_00 = (pDVar10->type).kids.T;
    }
    else {
      pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
      bG_00 = (DdNode *)((ulong)(pDVar10->type).kids.T ^ 1);
    }
  }
  pDVar7 = extraZddGetSymmetricVars(dd,pDVar5,pDVar7,(pDVar3->type).kids.T);
  if (pDVar7 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (pDVar7 != dd->zero) {
    pDVar10 = extraZddGetSymmetricVars(dd,pDVar6,bG_00,(pDVar3->type).kids.T);
    if (pDVar10 == (DdNode *)0x0) goto LAB_0067f3e9;
    piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar6 = cuddZddIntersect(dd,pDVar7,pDVar10);
    if (pDVar6 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,pDVar7);
      pDVar7 = pDVar10;
      goto LAB_0067f3e9;
    }
    piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,pDVar7);
    Cudd_RecursiveDerefZdd(dd,pDVar10);
    pDVar7 = pDVar6;
  }
  if (pDVar5 == bG_00) {
    pDVar10 = cuddZddGetNode(dd,pDVar3->index * 2,dd->one,dd->zero);
    if (pDVar10 == (DdNode *)0x0) goto LAB_0067f3e9;
    piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar5 = cuddZddUnion(dd,pDVar7,pDVar10);
    if (pDVar5 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDerefZdd(dd,pDVar7);
      Cudd_RecursiveDerefZdd(dd,pDVar10);
      pDVar7 = pDVar5;
      goto LAB_0067f269;
    }
  }
  else {
LAB_0067f269:
    if (bF != bG || pDVar3 == bVars) {
      uVar9 = (ulong)pDVar7 & 0xfffffffffffffffe;
      pDVar3 = pDVar7;
LAB_0067f287:
      *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + -1;
      cuddCacheInsert(dd,10,bF,bG,bVars,pDVar3);
      return pDVar3;
    }
    if (iVar8 <= dd->perm[bVars->index]) {
      __assert_fail("LevelFG > dd->perm[bVars->index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddSymm.c"
                    ,0x3b4,
                    "DdNode *extraZddGetSymmetricVars(DdManager *, DdNode *, DdNode *, DdNode *)");
    }
    pDVar3 = cuddBddExistAbstractRecur(dd,bVars,pDVar3);
    if (pDVar3 == (DdNode *)0x0) goto LAB_0067f3e9;
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar10 = extraZddGetSingletons(dd,pDVar3);
    if (pDVar10 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar3);
      goto LAB_0067f3e9;
    }
    piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar3);
    pDVar3 = cuddZddUnion(dd,pDVar7,pDVar10);
    if (pDVar3 != (DdNode *)0x0) {
      uVar9 = (ulong)pDVar3 & 0xfffffffffffffffe;
      *(int *)(uVar9 + 4) = *(int *)(uVar9 + 4) + 1;
      Cudd_RecursiveDerefZdd(dd,pDVar7);
      Cudd_RecursiveDerefZdd(dd,pDVar10);
      goto LAB_0067f287;
    }
  }
  Cudd_RecursiveDerefZdd(dd,pDVar7);
  pDVar7 = pDVar10;
LAB_0067f3e9:
  Cudd_RecursiveDerefZdd(dd,pDVar7);
  return (DdNode *)0x0;
}

Assistant:

DdNode * extraZddGetSymmetricVars( 
  DdManager * dd,    /* the DD manager */
  DdNode * bF,       /* the first function  - originally, the positive cofactor */
  DdNode * bG,       /* the second function - originally, the negative cofactor */
  DdNode * bVars)    /* the set of variables, on which F and G depend */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bF); 
    DdNode * bGR = Cudd_Regular(bG); 

    if ( cuddIsConstant(bFR) && cuddIsConstant(bGR) )
    {
        if ( bF == bG )
            return extraZddGetSingletons( dd, bVars );
        else 
            return z0;
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookupZdd(dd, DD_GET_SYMM_VARS_TAG, bF, bG, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;             
        DdNode * zPlus, * zTemp;
        DdNode * bF0, * bF1;             
        DdNode * bG0, * bG1;             
        DdNode * bVarsNew;
    
        int LevelF = cuddI(dd,bFR->index);
        int LevelG = cuddI(dd,bGR->index);
        int LevelFG;

        if ( LevelF < LevelG )
            LevelFG = LevelF;
        else
            LevelFG = LevelG;

        // at least one of the arguments is not a constant
        assert( LevelFG < dd->size );

        // every variable in bF and bG should be also in bVars, therefore LevelFG cannot be above LevelV
        // if LevelFG is below LevelV, scroll through the vars in bVars to the same level as LevelFG
        for ( bVarsNew = bVars; LevelFG > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) );
        assert( LevelFG == dd->perm[bVarsNew->index] );

        // cofactor the functions
        if ( LevelF == LevelFG )
        {
            if ( bFR != bF ) // bF is complemented 
            {
                bF0 = Cudd_Not( cuddE(bFR) );
                bF1 = Cudd_Not( cuddT(bFR) );
            }
            else
            {
                bF0 = cuddE(bFR);
                bF1 = cuddT(bFR);
            }
        }
        else 
            bF0 = bF1 = bF;

        if ( LevelG == LevelFG )
        {
            if ( bGR != bG ) // bG is complemented 
            {
                bG0 = Cudd_Not( cuddE(bGR) );
                bG1 = Cudd_Not( cuddT(bGR) );
            }
            else
            {
                bG0 = cuddE(bGR);
                bG1 = cuddT(bGR);
            }
        }
        else 
            bG0 = bG1 = bG;

        // solve subproblems
        zRes0 = extraZddGetSymmetricVars( dd, bF0, bG0, cuddT(bVarsNew) );
        if ( zRes0 == NULL ) 
            return NULL;
        cuddRef( zRes0 );

        // if there is not symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddGetSymmetricVars( dd, bF1, bG1, cuddT(bVarsNew) );
            if ( zRes1 == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables should belong to the resulting set 
            // for which the property is true for both cofactors
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // add one more singleton if the property is true for this variable
        if ( bF0 == bG1 )
        {
            zPlus = cuddZddGetNode( dd, 2*bVarsNew->index, z1, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );

            // add these variable pairs to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }

        if ( bF == bG && bVars != bVarsNew )
        { 
            // if the functions are equal, so are their cofactors
            // add those variables from V that are above F and G 

            DdNode * bVarsExtra;

            assert( LevelFG > dd->perm[bVars->index] );

            // create the BDD of the extra variables
            bVarsExtra = cuddBddExistAbstractRecur( dd, bVars, bVarsNew );
            if ( bVarsExtra == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( bVarsExtra );

            zPlus = extraZddGetSingletons( dd, bVarsExtra );
            if ( zPlus == NULL )
            {
                Cudd_RecursiveDeref( dd, bVarsExtra );
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( zPlus );
            Cudd_RecursiveDeref( dd, bVarsExtra );

            // add these to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }
        cuddDeref( zRes );

        cuddCacheInsert( dd, DD_GET_SYMM_VARS_TAG, bF, bG, bVars, zRes );
        return zRes;
    }
}